

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_state.c
# Opt level: O1

void setup_simple_state_c(kcc_kinematic_chain *kc,solver_state_c *s)

{
  size_t __nmemb;
  uint uVar1;
  gc_pose *pgVar2;
  gc_twist *pgVar3;
  gc_acc_twist *pgVar4;
  gc_acc_twist *pgVar5;
  gc_acc_twist *pgVar6;
  mc_wrench *pmVar7;
  mc_wrench *pmVar8;
  mc_wrench *pmVar9;
  mc_wrench *pmVar10;
  mc_wrench *pmVar11;
  mc_wrench *pmVar12;
  mc_wrench *pmVar13;
  mc_wrench *pmVar14;
  gc_pose *pgVar15;
  gc_twist *pgVar16;
  gc_acc_twist *pgVar17;
  mc_abi *pmVar18;
  mc_momentum *pmVar19;
  mc_wrench *pmVar20;
  joint_torque *pjVar21;
  joint_position *pjVar22;
  joint_velocity *pjVar23;
  joint_acceleration *pjVar24;
  void *pvVar25;
  size_t __nmemb_00;
  long lVar26;
  
  uVar1 = kc->number_of_segments;
  __nmemb_00 = (size_t)(int)uVar1;
  __nmemb = __nmemb_00 + 1;
  s->nbody = uVar1;
  s->nq = uVar1;
  s->nd = uVar1;
  pgVar15 = (gc_pose *)calloc(__nmemb_00,0x10);
  s->x_jnt = pgVar15;
  pgVar15 = (gc_pose *)calloc(__nmemb_00,0x10);
  s->x_rel = pgVar15;
  pgVar15 = (gc_pose *)calloc(__nmemb,0x10);
  s->x_tot = pgVar15;
  pgVar16 = (gc_twist *)calloc(__nmemb_00,0x10);
  s->xd_jnt = pgVar16;
  pgVar16 = (gc_twist *)calloc(__nmemb_00,0x10);
  s->xd_tf = pgVar16;
  pgVar16 = (gc_twist *)calloc(__nmemb,0x10);
  s->xd = pgVar16;
  pgVar17 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_jnt = pgVar17;
  pgVar17 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_net = pgVar17;
  pgVar17 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_bias = pgVar17;
  pgVar17 = (gc_acc_twist *)calloc(__nmemb,0x10);
  s->xdd_tf = pgVar17;
  pgVar17 = (gc_acc_twist *)calloc(__nmemb_00,0x10);
  s->xdd_nact = pgVar17;
  pgVar17 = (gc_acc_twist *)calloc(__nmemb,0x10);
  s->xdd = pgVar17;
  pmVar18 = (mc_abi *)calloc(__nmemb,0xd8);
  s->m_art = pmVar18;
  pmVar18 = (mc_abi *)calloc(__nmemb_00,0xd8);
  s->m_app = pmVar18;
  pmVar18 = (mc_abi *)calloc(__nmemb,0xd8);
  s->m_tf = pmVar18;
  pmVar19 = (mc_momentum *)calloc(__nmemb_00,0x10);
  s->p = pmVar19;
  pmVar20 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_bias_art = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_eom = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_app = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_tf = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_bias_nact = pmVar20;
  pjVar21 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_bias_art = pjVar21;
  pmVar20 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_ff_art = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ff_app = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ff_jnt = pmVar20;
  pjVar21 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ff_art = pjVar21;
  pjVar21 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ff = pjVar21;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb,0x10);
  s->f_ext_art = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext_app = pmVar20;
  pmVar20 = (mc_wrench *)calloc(__nmemb_00,0x10);
  s->f_ext_tf = pmVar20;
  pjVar21 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ext_art = pjVar21;
  pjVar22 = (joint_position *)calloc(__nmemb_00,8);
  s->q = pjVar22;
  pjVar23 = (joint_velocity *)calloc(__nmemb_00,8);
  s->qd = pjVar23;
  pjVar24 = (joint_acceleration *)calloc(__nmemb_00,8);
  s->qdd = pjVar24;
  pjVar21 = (joint_torque *)calloc(__nmemb_00,8);
  s->tau_ctrl = pjVar21;
  if (0 < (long)__nmemb_00) {
    pgVar15 = s->x_jnt;
    pgVar2 = s->x_rel;
    pgVar16 = s->xd_jnt;
    pgVar3 = s->xd_tf;
    pgVar17 = s->xdd_jnt;
    pgVar4 = s->xdd_bias;
    pgVar5 = s->xdd_net;
    pgVar6 = s->xdd_nact;
    pmVar19 = s->p;
    pmVar20 = s->f_bias_eom;
    pmVar7 = s->f_bias_app;
    pmVar8 = s->f_bias_tf;
    pmVar9 = s->f_bias_nact;
    pmVar10 = s->f_ff_app;
    pmVar11 = s->f_ff_jnt;
    pmVar12 = s->f_ext;
    pmVar13 = s->f_ext_app;
    pmVar14 = s->f_ext_tf;
    lVar26 = 0;
    do {
      pvVar25 = calloc(1,0x48);
      *(void **)((long)&pgVar15->rotation + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar15->translation + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x48);
      *(void **)((long)&pgVar2->rotation + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar2->translation + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar16->angular_velocity + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar16->linear_velocity + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar3->angular_velocity + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar3->linear_velocity + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar17->angular_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar17->linear_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar4->angular_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar4->linear_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar5->angular_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar5->linear_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar6->angular_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar6->linear_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar19->angular_momentum + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar19->linear_momentum + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar20->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar20->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar7->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar7->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar8->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar8->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar9->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar9->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar10->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar10->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar11->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar11->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar12->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar12->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar13->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar13->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar14->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar14->force + lVar26) = pvVar25;
      lVar26 = lVar26 + 0x10;
    } while (__nmemb_00 << 4 != lVar26);
  }
  if (-1 < (int)uVar1) {
    pgVar15 = s->x_tot;
    pgVar16 = s->xd;
    pgVar17 = s->xdd;
    pgVar4 = s->xdd_tf;
    pmVar20 = s->f_bias_art;
    pmVar7 = s->f_ff_art;
    pmVar8 = s->f_ext_art;
    lVar26 = 0;
    do {
      pvVar25 = calloc(1,0x48);
      *(void **)((long)&pgVar15->rotation + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar15->translation + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar16->angular_velocity + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar16->linear_velocity + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar17->angular_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar17->linear_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar4->angular_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pgVar4->linear_acceleration + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar20->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar20->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar7->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar7->force + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar8->torque + lVar26) = pvVar25;
      pvVar25 = calloc(1,0x18);
      *(void **)((long)&pmVar8->force + lVar26) = pvVar25;
      lVar26 = lVar26 + 0x10;
    } while ((ulong)uVar1 * 0x10 + 0x10 != lVar26);
  }
  *(undefined8 *)&s->x_tot->rotation->field_0 = 0x3ff0000000000000;
  *(undefined8 *)((long)&s->x_tot->rotation->field_0 + 0x20) = 0x3ff0000000000000;
  *(undefined8 *)((long)&s->x_tot->rotation->field_0 + 0x40) = 0x3ff0000000000000;
  return;
}

Assistant:

void setup_simple_state_c(
        const struct kcc_kinematic_chain *kc,
        struct solver_state_c *s)
{
    const int NR_SEGMENTS = kc->number_of_segments;
    const int NR_SEGMENTS_WITH_BASE = NR_SEGMENTS + 1;
    const int EE = NR_SEGMENTS;

    // FPK
    s->nbody = NR_SEGMENTS;
    s->nq = NR_SEGMENTS;
    // FVK
    s->nd = NR_SEGMENTS;

    // FPK
    s->x_jnt = calloc(NR_SEGMENTS, sizeof(struct gc_pose));
    s->x_rel = calloc(NR_SEGMENTS, sizeof(struct gc_pose));
    s->x_tot = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_pose));
    // FVK
    s->xd_jnt = calloc(NR_SEGMENTS, sizeof(struct gc_twist));
    s->xd_tf  = calloc(NR_SEGMENTS, sizeof(struct gc_twist));
    s->xd     = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_twist));
    // FAK
    s->xdd_jnt   = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_net   = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_bias  = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd_tf    = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_acc_twist));
    s->xdd_nact  = calloc(NR_SEGMENTS, sizeof(struct gc_acc_twist));
    s->xdd       = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct gc_acc_twist));
    // Inertia
    s->m_art = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_abi));
    s->m_app = calloc(NR_SEGMENTS, sizeof(struct mc_abi));
    s->m_tf  = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_abi));
    // Inertial force
    s->p            = calloc(NR_SEGMENTS, sizeof(struct mc_momentum));
    s->f_bias_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_bias_eom   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_tf    = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_bias_nact  = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_bias_art = calloc(s->nd, sizeof(joint_torque));
    // Feed-forward torque
    s->f_ff_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_ff_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ff_jnt   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_ff_art = calloc(s->nd, sizeof(joint_torque));
    // External force
    s->tau_ff      = calloc(s->nd, sizeof(joint_torque));
    s->f_ext       = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ext_art   = calloc(NR_SEGMENTS_WITH_BASE, sizeof(struct mc_wrench));
    s->f_ext_app   = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->f_ext_tf    = calloc(NR_SEGMENTS, sizeof(struct mc_wrench));
    s->tau_ext_art = calloc(s->nd, sizeof(joint_torque));

    // FPK
    s->q     = calloc(s->nq, sizeof(double));
    // FVK
    s->qd    = calloc(s->nd, sizeof(double));
    // FAK
    s->qdd   = calloc(s->nd, sizeof(double));
    // Dynamics
    s->tau_ctrl = calloc(s->nd, sizeof(joint_torque));

    for (int i = 0; i < NR_SEGMENTS; i++) {
        // FPK
        s->x_jnt[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_jnt[i].translation = calloc(1, sizeof(struct vector3));
        s->x_rel[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_rel[i].translation = calloc(1, sizeof(struct vector3));
        // FVK
        s->xd_jnt[i].angular_velocity = calloc(1, sizeof(struct vector3));
        s->xd_jnt[i].linear_velocity  = calloc(1, sizeof(struct vector3));
        s->xd_tf[i].angular_velocity  = calloc(1, sizeof(struct vector3));
        s->xd_tf[i].linear_velocity   = calloc(1, sizeof(struct vector3));
        // FAK
        s->xdd_jnt[i].angular_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_jnt[i].linear_acceleration   = calloc(1, sizeof(struct vector3));
        s->xdd_bias[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_bias[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_net[i].angular_acceleration  = calloc(1, sizeof(struct vector3));
        s->xdd_net[i].linear_acceleration   = calloc(1, sizeof(struct vector3));
        s->xdd_nact[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_nact[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        // Inertial force
        s->p[i].angular_momentum = calloc(1, sizeof(struct vector3));
        s->p[i].linear_momentum  = calloc(1, sizeof(struct vector3));
        s->f_bias_eom[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_bias_eom[i].force   = calloc(1, sizeof(struct vector3));
        s->f_bias_app[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_bias_app[i].force   = calloc(1, sizeof(struct vector3));
        s->f_bias_tf[i].torque   = calloc(1, sizeof(struct vector3));
        s->f_bias_tf[i].force    = calloc(1, sizeof(struct vector3));
        s->f_bias_nact[i].torque = calloc(1, sizeof(struct vector3));
        s->f_bias_nact[i].force  = calloc(1, sizeof(struct vector3));
        // Feed-forward torque
        s->f_ff_app[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_app[i].force  = calloc(1, sizeof(struct vector3));
        s->f_ff_jnt[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_jnt[i].force  = calloc(1, sizeof(struct vector3));
        // External force
        s->f_ext[i].torque     = calloc(1, sizeof(struct vector3));
        s->f_ext[i].force      = calloc(1, sizeof(struct vector3));
        s->f_ext_app[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ext_app[i].force  = calloc(1, sizeof(struct vector3));
        s->f_ext_tf[i].torque  = calloc(1, sizeof(struct vector3));
        s->f_ext_tf[i].force   = calloc(1, sizeof(struct vector3));
    }

    for (int i = 0; i < NR_SEGMENTS_WITH_BASE; i++) {
        // FPK
        s->x_tot[i].rotation    = calloc(1, sizeof(struct matrix3x3));
        s->x_tot[i].translation = calloc(1, sizeof(struct vector3));
        // FVK
        s->xd[i].angular_velocity        = calloc(1, sizeof(struct vector3));
        s->xd[i].linear_velocity         = calloc(1, sizeof(struct vector3));
        // FAK
        s->xdd[i].angular_acceleration    = calloc(1, sizeof(struct vector3));
        s->xdd[i].linear_acceleration     = calloc(1, sizeof(struct vector3));
        s->xdd_tf[i].angular_acceleration = calloc(1, sizeof(struct vector3));
        s->xdd_tf[i].linear_acceleration  = calloc(1, sizeof(struct vector3));
        // Inertial force
        s->f_bias_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_bias_art[i].force  = calloc(1, sizeof(struct vector3));
        // Feed-forward torque
        s->f_ff_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ff_art[i].force  = calloc(1, sizeof(struct vector3));
        // External force
        s->f_ext_art[i].torque = calloc(1, sizeof(struct vector3));
        s->f_ext_art[i].force  = calloc(1, sizeof(struct vector3));
    }

    // FPK
    s->x_tot[0].rotation->row_x.x = 1.0;
    s->x_tot[0].rotation->row_y.y = 1.0;
    s->x_tot[0].rotation->row_z.z = 1.0;
}